

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_texops(Context *ctx,char *opcode,int dims,int texbem)

{
  int regnum;
  MOJOSHADER_samplerMap *pMVar1;
  RegisterList *pRVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((ctx->dest_arg).regtype != REG_TYPE_ADDRESS) {
    failf(ctx,"%s destination must be a texture register",opcode);
  }
  if (ctx->source_args[0].regtype != REG_TYPE_ADDRESS) {
    failf(ctx,"%s source must be a texture register",opcode);
  }
  if ((ctx->dest_arg).regnum <= ctx->source_args[0].regnum) {
    failf(ctx,"%s dest must be a higher register than source",opcode);
  }
  if (dims != 0) {
    uVar4 = dims == 2 ^ 3;
    regnum = (ctx->dest_arg).regnum;
    pRVar2 = reglist_insert(ctx,&ctx->samplers,REG_TYPE_SAMPLER,regnum);
    pMVar1 = ctx->samplermap;
    if ((pMVar1 != (MOJOSHADER_samplerMap *)0x0) && ((ulong)ctx->samplermap_count != 0)) {
      uVar3 = 0;
      do {
        if (pMVar1[uVar3].index == regnum) {
          uVar4 = pMVar1[uVar3].type + MOJOSHADER_SAMPLER_VOLUME;
          break;
        }
        uVar3 = uVar3 + 1;
      } while (ctx->samplermap_count != uVar3);
    }
    pRVar2->index = uVar4;
    pRVar2->misc = pRVar2->misc | texbem;
  }
  uVar4 = (ctx->dest_arg).regnum;
  pRVar2 = reglist_insert(ctx,&ctx->attributes,REG_TYPE_ADDRESS,uVar4);
  pRVar2->usage = MOJOSHADER_USAGE_TEXCOORD;
  pRVar2->index = uVar4;
  pRVar2->writemask = 0xf;
  pRVar2->misc = 0;
  uVar4 = ctx->source_args[0].regnum;
  pRVar2 = reglist_insert(ctx,&ctx->attributes,REG_TYPE_ADDRESS,uVar4);
  pRVar2->usage = MOJOSHADER_USAGE_TEXCOORD;
  pRVar2->index = uVar4;
  pRVar2->writemask = 0xf;
  pRVar2->misc = 0;
  return;
}

Assistant:

static void state_texops(Context *ctx, const char *opcode,
                         const int dims, const int texbem)
{
    const DestArgInfo *dst = &ctx->dest_arg;
    const SourceArgInfo *src = &ctx->source_args[0];
    if (dst->regtype != REG_TYPE_TEXTURE)
        failf(ctx, "%s destination must be a texture register", opcode);
    if (src->regtype != REG_TYPE_TEXTURE)
        failf(ctx, "%s source must be a texture register", opcode);
    if (src->regnum >= dst->regnum)  // so says MSDN.
        failf(ctx, "%s dest must be a higher register than source", opcode);

    if (dims)
    {
        TextureType ttyp = (dims == 2) ? TEXTURE_TYPE_2D : TEXTURE_TYPE_CUBE;
        add_sampler(ctx, dst->regnum, ttyp, texbem);
    } // if

    add_attribute_register(ctx, REG_TYPE_TEXTURE, dst->regnum,
                           MOJOSHADER_USAGE_TEXCOORD, dst->regnum, 0xF, 0);

    // Strictly speaking, there should be a TEX opcode prior to this call that
    //  should fill in this metadata, but I'm not sure that's required for the
    //  shader to assemble in D3D, so we'll do this so we don't fail with a
    //  cryptic error message even if the developer didn't do the TEX.
    add_attribute_register(ctx, REG_TYPE_TEXTURE, src->regnum,
                           MOJOSHADER_USAGE_TEXCOORD, src->regnum, 0xF, 0);
}